

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi_uc sVar2;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  byte *pbVar3;
  stbi__context *psVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  stbi_uc sVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int depth;
  int iVar17;
  stbi_uc *psVar18;
  stbi_uc *psVar19;
  stbi_uc *psVar20;
  int out_n;
  size_t sVar21;
  stbi__uint32 raw_len_00;
  byte bVar22;
  uint uVar23;
  long lVar24;
  stbi_uc *psVar25;
  byte bVar26;
  long lVar27;
  uint uVar28;
  stbi__uint16 *tc_00;
  ulong uVar29;
  stbi__png *z_00;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  ulong local_4e0;
  ulong local_4d0;
  stbi_uc tc [3];
  ulong local_4c0;
  size_t local_480;
  stbi__uint32 raw_len;
  ulong local_458;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar10 = stbi__check_png_header(s);
  if (iVar10 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  psVar19 = s->buffer_start;
  psVar20 = s->buffer_start + 1;
  bVar5 = true;
  bVar9 = 0;
  uVar14 = 0;
  bVar6 = false;
  local_4c0 = 0;
  local_480 = 0;
  local_4e0 = 0;
  bVar7 = false;
  bVar26 = 0;
  do {
    iVar10 = stbi__get16be(s);
    uVar11 = stbi__get16be(s);
    uVar31 = iVar10 * 0x10000 + uVar11;
    uVar12 = stbi__get16be(s);
    uVar13 = stbi__get16be(s);
    uVar30 = uVar12 << 0x10 | uVar13;
    uVar16 = (uint)local_4c0;
    uVar23 = (uint)local_4e0;
    if ((int)uVar30 < 0x49484452) {
      if (uVar30 == 0x43674249) {
        bVar6 = true;
      }
      else {
        if (uVar30 == 0x49444154) {
          if (bVar5) goto LAB_0028a23f;
          if ((bVar26 != 0) && (uVar16 == 0)) {
            stbi__g_failure_reason = "no PLTE";
            return 0;
          }
          if (scan == 2) {
            s->img_n = (uint)bVar26;
            return 1;
          }
          uVar11 = uVar31 + uVar23;
          if ((int)uVar11 < (int)uVar23) {
            return 0;
          }
          if ((uint)local_480 < uVar11) {
            sVar21 = 0x1000;
            if (0x1000 < uVar31) {
              sVar21 = (ulong)uVar31;
            }
            if ((uint)local_480 != 0) {
              sVar21 = local_480;
            }
            do {
              local_480 = sVar21;
              sVar21 = (ulong)((uint)local_480 * 2);
            } while ((uint)local_480 < uVar11);
            psVar18 = (stbi_uc *)realloc(*ppsVar1,local_480);
            if (psVar18 == (stbi_uc *)0x0) goto LAB_0028a7b3;
            *ppsVar1 = psVar18;
          }
          else {
            psVar18 = *ppsVar1;
          }
          iVar10 = stbi__getn(s,psVar18 + local_4e0,uVar31);
          bVar5 = false;
          uVar23 = uVar11;
          if (iVar10 == 0) {
            stbi__g_failure_reason = "outofdata";
            return 0;
          }
          goto LAB_00289edb;
        }
        if (uVar30 == 0x49454e44) {
          if (bVar5) goto LAB_0028a23f;
          if (scan != 0) {
            return 1;
          }
          if (*ppsVar1 == (stbi_uc *)0x0) {
            stbi__g_failure_reason = "no IDAT";
            return 0;
          }
          raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
          psVar19 = (stbi_uc *)
                    stbi_zlib_decode_malloc_guesssize_headerflag
                              ((char *)*ppsVar1,uVar23,raw_len,(int *)&raw_len,(uint)!bVar6);
          z->expanded = psVar19;
          if (psVar19 == (stbi_uc *)0x0) {
            return 0;
          }
          free(z->idata);
          raw_len_00 = raw_len;
          z->idata = (stbi_uc *)0x0;
          iVar10 = s->img_n + 1;
          iVar15 = s->img_n;
          if (bVar7) {
            iVar15 = iVar10;
          }
          out_n = iVar15;
          if (req_comp != 3) {
            out_n = iVar10;
          }
          if (bVar26 != 0) {
            out_n = iVar15;
          }
          if (iVar10 != req_comp) {
            out_n = iVar15;
          }
          s->img_out_n = out_n;
          uVar23 = z->depth;
          local_458 = (ulong)uVar23;
          psVar19 = z->expanded;
          x = z->s->img_x;
          y = z->s->img_y;
          if (bVar9 == 0) {
            iVar10 = stbi__create_png_image_raw(z,psVar19,raw_len,out_n,x,y,uVar23,uVar14);
            if (iVar10 == 0) {
              return 0;
            }
          }
          else {
            iVar10 = out_n << (uVar23 == 0x10);
            psVar20 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar10,0);
            sVar21 = (size_t)iVar10;
            lVar24 = 0;
            do {
              uVar23 = (&DAT_00458fa0)[lVar24];
              psVar4 = z->s;
              uVar11 = (&DAT_00458fe0)[lVar24];
              uVar28 = ~uVar23 + psVar4->img_x + uVar11;
              uVar16 = uVar28 / uVar11;
              uVar12 = (&DAT_00458fc0)[lVar24];
              uVar13 = (&DAT_00459000)[lVar24];
              uVar31 = ~uVar12 + psVar4->img_y + uVar13;
              uVar30 = uVar31 / uVar13;
              if ((uVar11 <= uVar28) && (uVar13 <= uVar31)) {
                depth = (int)local_458;
                iVar15 = psVar4->img_n;
                iVar17 = stbi__create_png_image_raw
                                   (z,psVar19,raw_len_00,out_n,uVar16,uVar30,depth,uVar14);
                if (iVar17 == 0) {
                  free(psVar20);
                  return 0;
                }
                if (0 < (int)uVar30) {
                  local_4d0 = 0;
                  iVar17 = uVar12 * iVar10;
                  do {
                    if (0 < (int)uVar16) {
                      lVar27 = 0;
                      psVar18 = z->out;
                      psVar25 = psVar20 + (ulong)(z->s->img_x * iVar17) + (long)(int)uVar23 * sVar21
                      ;
                      do {
                        memcpy(psVar25,psVar18 + (lVar27 + local_4d0 * (long)(int)uVar16) * sVar21,
                               sVar21);
                        lVar27 = lVar27 + 1;
                        psVar25 = psVar25 + (long)(int)uVar11 * sVar21;
                      } while (lVar27 < (int)uVar16);
                    }
                    iVar17 = iVar17 + uVar13 * iVar10;
                    local_4d0 = local_4d0 + 1;
                  } while (local_4d0 < uVar30);
                }
                uVar30 = (((int)(uVar16 * depth * iVar15 + 7) >> 3) + 1) * uVar30;
                free(z->out);
                psVar19 = psVar19 + uVar30;
                raw_len_00 = raw_len_00 - uVar30;
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 != 7);
            z->out = psVar20;
          }
          if (bVar7) {
            z_00 = (stbi__png *)(ulong)z->s->img_x;
            tc_00 = (stbi__uint16 *)(ulong)z->s->img_y;
            iVar10 = (int)z->out;
            if (z->depth == 0x10) {
              stbi__compute_transparency16(z_00,tc_00,iVar10);
            }
            else {
              stbi__compute_transparency(z_00,(stbi_uc *)tc_00,iVar10);
            }
          }
          if (((bVar6) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
            stbi__de_iphone((stbi__png *)z->s);
          }
          if (bVar26 == 0) {
            if (bVar7) {
              s->img_n = s->img_n + 1;
            }
          }
          else {
            s->img_n = (uint)bVar26;
            uVar14 = (uint)bVar26;
            if (2 < req_comp) {
              uVar14 = req_comp;
            }
            s->img_out_n = uVar14;
            psVar19 = z->out;
            uVar23 = z->s->img_y * z->s->img_x;
            psVar20 = (stbi_uc *)stbi__malloc_mad2(uVar23,uVar14,0);
            if (psVar20 == (stbi_uc *)0x0) {
LAB_0028a7b3:
              stbi__g_failure_reason = "outofmem";
              return 0;
            }
            if (uVar14 == 3) {
              if (uVar23 != 0) {
                uVar32 = 0;
                psVar18 = psVar20;
                do {
                  uVar29 = (ulong)psVar19[uVar32];
                  uVar32 = uVar32 + 1;
                  sVar8 = palette[uVar29 * 4 + 1];
                  sVar2 = palette[uVar29 * 4 + 2];
                  *psVar18 = palette[uVar29 * 4];
                  psVar18[1] = sVar8;
                  psVar18[2] = sVar2;
                  psVar18 = psVar18 + 3;
                } while (uVar23 != uVar32);
              }
            }
            else if (uVar23 != 0) {
              uVar32 = 0;
              do {
                *(undefined4 *)(psVar20 + uVar32 * 4) =
                     *(undefined4 *)(palette + (ulong)psVar19[uVar32] * 4);
                uVar32 = uVar32 + 1;
              } while (uVar23 != uVar32);
            }
            free(psVar19);
            z->out = psVar20;
          }
          free(z->expanded);
          z->expanded = (stbi_uc *)0x0;
          return 1;
        }
LAB_00289eae:
        if (bVar5) {
LAB_0028a23f:
          stbi__g_failure_reason = "first not IHDR";
          return 0;
        }
        bVar5 = false;
        if ((uVar12 >> 0xd & 1) == 0) {
          stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
          stbi__parse_png_file::invalid_chunk[0] = (char)(uVar12 >> 8);
          stbi__parse_png_file::invalid_chunk[1] = (char)uVar12;
          stbi__parse_png_file::invalid_chunk[2] = (char)(uVar13 >> 8);
          stbi__parse_png_file::invalid_chunk[3] = (char)uVar13;
          return 0;
        }
      }
      stbi__skip(s,uVar31);
    }
    else if (uVar30 == 0x74524e53) {
      if (bVar5) goto LAB_0028a23f;
      if (*ppsVar1 != (stbi_uc *)0x0) {
        stbi__g_failure_reason = "tRNS after IDAT";
        return 0;
      }
      if (bVar26 == 0) {
        uVar11 = s->img_n;
        if ((uVar11 & 1) == 0) {
          stbi__g_failure_reason = "tRNS with alpha";
          return 0;
        }
        if (uVar11 * 2 != uVar31) {
LAB_0028a2bd:
          stbi__g_failure_reason = "bad tRNS len";
          return 0;
        }
        if (z->depth == 0x10) {
          if (0 < (int)uVar11) {
            lVar24 = 0;
            do {
              iVar10 = stbi__get16be(s);
              tc16[lVar24] = (stbi__uint16)iVar10;
              lVar24 = lVar24 + 1;
            } while (lVar24 < s->img_n);
          }
        }
        else if (0 < (int)uVar11) {
          lVar24 = 0;
          do {
            iVar10 = stbi__get16be(s);
            tc[lVar24] = ""[z->depth] * (char)iVar10;
            lVar24 = lVar24 + 1;
          } while (lVar24 < s->img_n);
        }
        bVar7 = true;
        bVar5 = false;
        bVar26 = 0;
      }
      else {
        if (scan == 2) {
          s->img_n = 4;
          return 1;
        }
        if (uVar16 == 0) {
          stbi__g_failure_reason = "tRNS before PLTE";
          return 0;
        }
        if (uVar16 < uVar31) goto LAB_0028a2bd;
        bVar5 = false;
        bVar26 = 4;
        if (uVar31 != 0) {
          psVar18 = s->img_buffer;
          psVar25 = s->img_buffer_end;
          uVar32 = 0;
          do {
            if (psVar18 < psVar25) {
              s->img_buffer = psVar18 + 1;
              bVar22 = *psVar18;
              psVar18 = psVar18 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              bVar22 = 0;
            }
            else {
              iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
              if (iVar15 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar22 = 0;
                psVar25 = psVar20;
              }
              else {
                bVar22 = *psVar19;
                psVar25 = psVar19 + iVar15;
              }
              s->img_buffer_end = psVar25;
              s->img_buffer = psVar20;
              psVar18 = psVar20;
            }
            palette[uVar32 * 4 + 3] = bVar22;
            uVar32 = uVar32 + 1;
          } while (uVar11 + iVar10 * 0x10000 != uVar32);
        }
      }
    }
    else if (uVar30 == 0x504c5445) {
      if (bVar5) goto LAB_0028a23f;
      if ((0x300 < uVar31) ||
         (uVar12 = uVar11 * 0xaaab >> 0x11, local_4c0 = (ulong)uVar12, uVar12 * 3 != uVar31)) {
        stbi__g_failure_reason = "invalid PLTE";
        return 0;
      }
      bVar5 = false;
      if (2 < uVar11) {
        psVar18 = s->img_buffer;
        psVar25 = s->img_buffer_end;
        uVar32 = 0;
        do {
          if (psVar18 < psVar25) {
            s->img_buffer = psVar18 + 1;
            bVar22 = *psVar18;
            psVar18 = psVar18 + 1;
          }
          else if (s->read_from_callbacks == 0) {
            bVar22 = 0;
          }
          else {
            iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
            if (iVar10 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar22 = 0;
              psVar25 = psVar20;
            }
            else {
              bVar22 = *psVar19;
              psVar25 = psVar19 + iVar10;
            }
            s->img_buffer_end = psVar25;
            s->img_buffer = psVar20;
            psVar18 = psVar20;
          }
          palette[uVar32 * 4] = bVar22;
          if (psVar18 < psVar25) {
            s->img_buffer = psVar18 + 1;
            bVar22 = *psVar18;
            psVar18 = psVar18 + 1;
          }
          else if (s->read_from_callbacks == 0) {
            bVar22 = 0;
          }
          else {
            iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
            if (iVar10 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar22 = 0;
              psVar25 = psVar20;
            }
            else {
              bVar22 = *psVar19;
              psVar25 = psVar19 + iVar10;
            }
            s->img_buffer_end = psVar25;
            s->img_buffer = psVar20;
            psVar18 = psVar20;
          }
          palette[uVar32 * 4 + 1] = bVar22;
          if (psVar18 < psVar25) {
            s->img_buffer = psVar18 + 1;
            bVar22 = *psVar18;
            psVar18 = psVar18 + 1;
          }
          else if (s->read_from_callbacks == 0) {
            bVar22 = 0;
          }
          else {
            iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
            if (iVar10 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar22 = 0;
              psVar25 = psVar20;
            }
            else {
              bVar22 = *psVar19;
              psVar25 = psVar19 + iVar10;
            }
            s->img_buffer_end = psVar25;
            s->img_buffer = psVar20;
            psVar18 = psVar20;
          }
          palette[uVar32 * 4 + 2] = bVar22;
          palette[uVar32 * 4 + 3] = 0xff;
          uVar32 = uVar32 + 1;
        } while (local_4c0 != uVar32);
      }
    }
    else {
      if (uVar30 != 0x49484452) goto LAB_00289eae;
      if (!bVar5) {
        stbi__g_failure_reason = "multiple IHDR";
        return 0;
      }
      if (uVar31 != 0xd) {
        stbi__g_failure_reason = "bad IHDR len";
        return 0;
      }
      iVar10 = stbi__get16be(s);
      uVar14 = stbi__get16be(s);
      uVar14 = uVar14 | iVar10 << 0x10;
      s->img_x = uVar14;
      if (0x1000000 < uVar14) {
LAB_0028a213:
        stbi__g_failure_reason = "too large";
        return 0;
      }
      iVar10 = stbi__get16be(s);
      uVar14 = stbi__get16be(s);
      uVar14 = uVar14 | iVar10 << 0x10;
      s->img_y = uVar14;
      if (0x1000000 < uVar14) goto LAB_0028a213;
      pbVar3 = s->img_buffer;
      psVar18 = s->img_buffer_end;
      if (pbVar3 < psVar18) {
        s->img_buffer = pbVar3 + 1;
        bVar9 = *pbVar3;
        psVar25 = pbVar3 + 1;
      }
      else {
        if (s->read_from_callbacks == 0) {
          z->depth = 0;
          goto LAB_0028a31c;
        }
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar9 = 0;
          psVar18 = psVar20;
        }
        else {
          bVar9 = *psVar19;
          psVar18 = psVar19 + iVar10;
        }
        s->img_buffer_end = psVar18;
        s->img_buffer = psVar20;
        psVar25 = psVar20;
      }
      z->depth = (uint)bVar9;
      if ((0x10 < bVar9) || ((0x10116U >> (bVar9 & 0x1f) & 1) == 0)) {
LAB_0028a31c:
        stbi__g_failure_reason = "1/2/4/8/16-bit only";
        return 0;
      }
      if (psVar25 < psVar18) {
        s->img_buffer = psVar25 + 1;
        uVar14 = (uint)*psVar25;
        psVar25 = psVar25 + 1;
LAB_0028a0a4:
        bVar22 = (byte)uVar14;
        if (6 < bVar22) {
LAB_0028a22e:
          stbi__g_failure_reason = "bad ctype";
          return 0;
        }
        if (bVar22 == 3) {
          if (z->depth == 0x10) goto LAB_0028a22e;
          uVar14 = 3;
          bVar22 = 3;
          bVar26 = 3;
        }
        else if ((uVar14 & 1) != 0) goto LAB_0028a22e;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
          if (iVar10 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            uVar14 = 0;
            psVar18 = psVar20;
          }
          else {
            uVar14 = (uint)*psVar19;
            psVar18 = psVar19 + iVar10;
          }
          s->img_buffer_end = psVar18;
          s->img_buffer = psVar20;
          psVar25 = psVar20;
          goto LAB_0028a0a4;
        }
        bVar22 = 0;
        uVar14 = 0;
      }
      if (psVar25 < psVar18) {
        s->img_buffer = psVar25 + 1;
        bVar9 = *psVar25;
LAB_0028a13f:
        if (bVar9 != 0) {
          stbi__g_failure_reason = "bad comp method";
          return 0;
        }
      }
      else if (s->read_from_callbacks != 0) {
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar9 = 0;
          psVar18 = psVar20;
        }
        else {
          bVar9 = *psVar19;
          psVar18 = psVar19 + iVar10;
        }
        s->img_buffer_end = psVar18;
        s->img_buffer = psVar20;
        goto LAB_0028a13f;
      }
      sVar8 = stbi__get8(s);
      if (sVar8 != '\0') {
        stbi__g_failure_reason = "bad filter method";
        return 0;
      }
      bVar9 = stbi__get8(s);
      if (1 < bVar9) {
        stbi__g_failure_reason = "bad interlace method";
        return 0;
      }
      uVar11 = s->img_x;
      if ((uVar11 == 0) || (uVar12 = s->img_y, uVar12 == 0)) {
        stbi__g_failure_reason = "0-pixel image";
        return 0;
      }
      if (bVar26 == 0) {
        uVar13 = (3 < bVar22) + 1 + (uVar14 & 2);
        s->img_n = uVar13;
        if ((uint)((0x40000000 / (ulong)uVar11) / (ulong)uVar13) < uVar12) goto LAB_0028a213;
        bVar5 = false;
        bVar26 = 0;
        if (scan == 2) {
          return 1;
        }
      }
      else {
        s->img_n = 1;
        bVar5 = false;
        if ((uint)(0x40000000 / (ulong)uVar11 >> 2) < uVar12) goto LAB_0028a213;
      }
    }
LAB_00289edb:
    stbi__get16be(s);
    stbi__get16be(s);
    local_4e0 = (ulong)uVar23;
  } while( true );
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}